

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_context.cpp
# Opt level: O0

LoopDescriptor * __thiscall spvtools::opt::IRContext::GetLoopDescriptor(IRContext *this,Function *f)

{
  bool bVar1;
  pointer ppVar2;
  pair<std::__detail::_Node_iterator<std::pair<const_spvtools::opt::Function_*const,_spvtools::opt::LoopDescriptor>,_false,_false>,_bool>
  pVar3;
  LoopDescriptor local_238;
  pair<const_spvtools::opt::Function_*,_spvtools::opt::LoopDescriptor> local_140;
  _Node_iterator_base<std::pair<const_spvtools::opt::Function_*const,_spvtools::opt::LoopDescriptor>,_false>
  local_40;
  undefined1 local_38;
  _Node_iterator_base<std::pair<const_spvtools::opt::Function_*const,_spvtools::opt::LoopDescriptor>,_false>
  local_30;
  _Node_iterator_base<std::pair<const_spvtools::opt::Function_*const,_spvtools::opt::LoopDescriptor>,_false>
  local_28;
  iterator it;
  Function *f_local;
  IRContext *this_local;
  
  it.
  super__Node_iterator_base<std::pair<const_spvtools::opt::Function_*const,_spvtools::opt::LoopDescriptor>,_false>
  ._M_cur = (_Node_iterator_base<std::pair<const_spvtools::opt::Function_*const,_spvtools::opt::LoopDescriptor>,_false>
             )(_Node_iterator_base<std::pair<const_spvtools::opt::Function_*const,_spvtools::opt::LoopDescriptor>,_false>
               )f;
  bVar1 = AreAnalysesValid(this,kAnalysisLoopAnalysis);
  if (!bVar1) {
    ResetLoopAnalysis(this);
  }
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<const_spvtools::opt::Function_*,_spvtools::opt::LoopDescriptor,_std::hash<const_spvtools::opt::Function_*>,_std::equal_to<const_spvtools::opt::Function_*>,_std::allocator<std::pair<const_spvtools::opt::Function_*const,_spvtools::opt::LoopDescriptor>_>_>
       ::find(&this->loop_descriptors_,(key_type *)&it);
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<const_spvtools::opt::Function_*,_spvtools::opt::LoopDescriptor,_std::hash<const_spvtools::opt::Function_*>,_std::equal_to<const_spvtools::opt::Function_*>,_std::allocator<std::pair<const_spvtools::opt::Function_*const,_spvtools::opt::LoopDescriptor>_>_>
       ::end(&this->loop_descriptors_);
  bVar1 = std::__detail::operator==(&local_28,&local_30);
  if (bVar1) {
    LoopDescriptor::LoopDescriptor
              (&local_238,this,
               (Function *)
               it.
               super__Node_iterator_base<std::pair<const_spvtools::opt::Function_*const,_spvtools::opt::LoopDescriptor>,_false>
               ._M_cur);
    std::make_pair<spvtools::opt::Function_const*&,spvtools::opt::LoopDescriptor>
              (&local_140,(Function **)&it,&local_238);
    pVar3 = std::
            unordered_map<spvtools::opt::Function_const*,spvtools::opt::LoopDescriptor,std::hash<spvtools::opt::Function_const*>,std::equal_to<spvtools::opt::Function_const*>,std::allocator<std::pair<spvtools::opt::Function_const*const,spvtools::opt::LoopDescriptor>>>
            ::emplace<std::pair<spvtools::opt::Function_const*,spvtools::opt::LoopDescriptor>>
                      ((unordered_map<spvtools::opt::Function_const*,spvtools::opt::LoopDescriptor,std::hash<spvtools::opt::Function_const*>,std::equal_to<spvtools::opt::Function_const*>,std::allocator<std::pair<spvtools::opt::Function_const*const,spvtools::opt::LoopDescriptor>>>
                        *)&this->loop_descriptors_,&local_140);
    local_40._M_cur =
         (__node_type *)
         pVar3.first.
         super__Node_iterator_base<std::pair<const_spvtools::opt::Function_*const,_spvtools::opt::LoopDescriptor>,_false>
         ._M_cur;
    local_38 = pVar3.second;
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_spvtools::opt::Function_*const,_spvtools::opt::LoopDescriptor>,_false,_false>
             ::operator->((_Node_iterator<std::pair<const_spvtools::opt::Function_*const,_spvtools::opt::LoopDescriptor>,_false,_false>
                           *)&local_40);
    std::pair<const_spvtools::opt::Function_*,_spvtools::opt::LoopDescriptor>::~pair(&local_140);
    LoopDescriptor::~LoopDescriptor(&local_238);
  }
  else {
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_spvtools::opt::Function_*const,_spvtools::opt::LoopDescriptor>,_false,_false>
             ::operator->((_Node_iterator<std::pair<const_spvtools::opt::Function_*const,_spvtools::opt::LoopDescriptor>,_false,_false>
                           *)&local_28);
  }
  this_local = (IRContext *)&ppVar2->second;
  return (LoopDescriptor *)this_local;
}

Assistant:

LoopDescriptor* IRContext::GetLoopDescriptor(const Function* f) {
  if (!AreAnalysesValid(kAnalysisLoopAnalysis)) {
    ResetLoopAnalysis();
  }

  std::unordered_map<const Function*, LoopDescriptor>::iterator it =
      loop_descriptors_.find(f);
  if (it == loop_descriptors_.end()) {
    return &loop_descriptors_
                .emplace(std::make_pair(f, LoopDescriptor(this, f)))
                .first->second;
  }

  return &it->second;
}